

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

bool __thiscall Indexing::CodeTree::RemovingMatcher<false>::next(RemovingMatcher<false> *this)

{
  BTPoint elem;
  bool bVar1;
  bool bVar2;
  CodeOp *pCVar3;
  BTPoint local_40;
  
  if (this->fresh == true) {
    this->fresh = false;
  }
  else {
    bVar1 = backtrack(this);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = false;
LAB_00285ad3:
  do {
    pCVar3 = (this->super_BaseMatcher).op;
    if (pCVar3->_alternative != (CodeOp *)0x0) {
      BTPoint::BTPoint(&local_40,(this->super_BaseMatcher).tp,pCVar3->_alternative,
                       (long)this->firstsInBlocks->_cursor - (long)this->firstsInBlocks->_stack >> 3
                      );
      elem.op = local_40.op;
      elem.tp = local_40.tp;
      elem.fibDepth = local_40.fibDepth;
      Lib::Stack<Indexing::CodeTree::RemovingMatcher<false>::BTPoint>::push(&this->btStack,elem);
      pCVar3 = (this->super_BaseMatcher).op;
    }
    switch((uint)pCVar3->_content & 7) {
    case 0:
      if ((pCVar3->_content != 0) && (this->matchingClauses == false)) {
        return true;
      }
      goto LAB_00285b85;
    case 1:
      bVar1 = BaseMatcher::doCheckGroundTerm(&this->super_BaseMatcher);
      break;
    case 2:
      return true;
    case 3:
      bVar1 = doCheckFun(this);
      break;
    case 4:
      bVar1 = doAssignVar(this);
      break;
    case 5:
      bVar1 = doCheckVar(this);
      break;
    case 6:
      bVar2 = doSearchStruct(this);
      if (!bVar2) goto LAB_00285b85;
      goto LAB_00285ad3;
    case 7:
      if (bVar1) goto LAB_00285b85;
      goto LAB_00285b7a;
    }
    if (bVar1 == false) {
LAB_00285b85:
      bVar2 = backtrack(this);
      bVar1 = true;
      if (!bVar2) {
        return false;
      }
    }
    else {
LAB_00285b7a:
      (this->super_BaseMatcher).op = (this->super_BaseMatcher).op + 1;
      bVar1 = false;
    }
  } while( true );
}

Assistant:

bool CodeTree::RemovingMatcher<checkRange>::next()
{
  if(fresh) {
    fresh=false;
  }
  else {
    //we backtrack from what we found in the previous run
    if(!backtrack()) {
      return false;
    }
  }


  bool shouldBacktrack=false;
  for(;;) {
    if(op->alternative()) {
      btStack.push(BTPoint(tp, op->alternative(), firstsInBlocks->size()));
    }
    switch(op->_instruction()) {
      case SUCCESS_OR_FAIL:
        if(op->isFail()) {
          shouldBacktrack=true;
          break;
        }
        if(matchingClauses) {
          //we can succeed only in certain depth and that will be handled separately
          shouldBacktrack=true;
        }
        else {
          //we are matching terms in a TermCodeTree
          return true;
        }
        break;
      case LIT_END:
        ASS(matchingClauses);
        return true;
      case CHECK_GROUND_TERM:
        shouldBacktrack=!doCheckGroundTerm();
        break;
      case CHECK_FUN:
        shouldBacktrack=!doCheckFun();
        break;
      case ASSIGN_VAR:
        shouldBacktrack=!doAssignVar();
        break;
      case CHECK_VAR:
        shouldBacktrack=!doCheckVar();
        break;
      case SEARCH_STRUCT:
        if(doSearchStruct()) {
          //a new value of @b op is assigned, so restart the loop
          continue;
        }
        else {
          shouldBacktrack=true;
        }
        break;
    }
    if(shouldBacktrack) {
      if(!backtrack()) {
        return false;
      }
      // dead store, left here in case it should have been a static?
      // shouldBacktrack = false;
    }
    else {
      //the SEARCH_STRUCT operation does not appear in CodeBlocks
      ASS(!op->isSearchStruct());
      //In each CodeBlock there is always either operation LIT_END or FAIL.
      //As we haven't encountered one yet, we may safely increase the
      //operation pointer
      op++;
    }
  }
}